

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>,std::tuple<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,int,unsigned_int>>
               (tuple<testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                *matcher_tuple,
               tuple<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
               *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>,std::tuple<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,int,unsigned_int>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<int>::Matches
                      ((MatcherBase<int> *)
                       &(matcher_tuple->
                        super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                        ).
                        super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                        .super__Head_base<1UL,_testing::Matcher<int>,_false>,
                       &(value_tuple->
                        super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
                        ).super__Tuple_impl<1UL,_int,_unsigned_int>.
                        super__Head_base<1UL,_int,_false>._M_head_impl);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }